

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O0

blob_t blobCreate(size_t size)

{
  void *in_RDI;
  size_t *ptr;
  undefined8 *local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = (undefined8 *)0x0;
  }
  else {
    local_8 = (undefined8 *)memAlloc(0x115f3d);
    if (local_8 == (undefined8 *)0x0) {
      local_8 = (undefined8 *)0x0;
    }
    else {
      *local_8 = in_RDI;
      memSet(in_RDI,(octet)((ulong)local_8 >> 0x38),0x115f73);
      local_8 = local_8 + 1;
    }
  }
  return local_8;
}

Assistant:

blob_t blobCreate(size_t size)
{
	size_t* ptr;
	if (size == 0)
		return 0;
	ptr = (size_t*)memAlloc(blobActualSize(size));
	if (ptr == 0)
		return 0;
	*ptr = size;
	memSetZero(blobValueOf(ptr), size);
	return blobValueOf(ptr);
}